

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfQueue.c
# Opt level: O2

void sbfQueue_dispatch(sbfQueue queue)

{
  sbfQueueItem data;
  long lVar1;
  int *piVar2;
  sbfQueue timeout;
  void *in_R8;
  int in_R9D;
  
  LOCK();
  (queue->mRefCount).mRefCount = (queue->mRefCount).mRefCount + 1;
  UNLOCK();
  timeout = queue;
  sbfLog_log(queue->mLog,0,"queue %p entered");
  do {
    if (((queue->mFlags & 1) == 0) && ((queue->mHiResTimers).rbh_root == (sbfHiResTimerImpl *)0x0))
    {
LAB_00103489:
      data = sbfQueueNext(queue);
      if (data == (sbfQueueItem)0x0) {
        LOCK();
        queue->mWaiting = 1;
        UNLOCK();
        data = sbfQueueNext(queue);
        if (data != (sbfQueueItem)0x0) {
          LOCK();
          queue->mWaiting = 0;
          UNLOCK();
          goto LAB_00103445;
        }
        do {
          lVar1 = futex(&queue->mWaiting,0,1,(timespec *)timeout,in_R8,in_R9D);
          if (lVar1 == 0) break;
          piVar2 = __errno_location();
        } while (*piVar2 != 0xb);
        goto LAB_00103489;
      }
LAB_00103445:
      if (data->mCb != (sbfQueueCb)0x0) {
        (*data->mCb)(data,data->mClosure);
      }
      sbfPool_put(data);
      if (data->mCb == (sbfQueueCb)0x0) {
        sbfQueue_removeRef(queue);
        sbfLog_log(queue->mLog,0,"queue %p exited",queue);
        sbfQueue_removeRef(queue);
        return;
      }
    }
    else {
      data = sbfQueueNext(queue);
      if (data != (sbfQueueItem)0x0) goto LAB_00103445;
    }
    sbfHiResTimer_queueDispatch(queue);
  } while( true );
}

Assistant:

void
sbfQueue_dispatch (sbfQueue queue)
{
    sbfQueueItem item;

    sbfQueue_addRef (queue);
    sbfLog_debug (queue->mLog, "queue %p entered", queue);

    for (;;)
    {
        item = sbfQueueDequeue (queue);
        if (SBF_LIKELY (item != NULL))
        {
            if (SBF_LIKELY (item->mCb != NULL))
                item->mCb (item, item->mClosure);
            sbfPool_put (item);
            if (SBF_UNLIKELY (item->mCb == NULL))
            {
                sbfQueue_removeRef (queue);
                break; /* NULL callback means destroyed */
            }
        }
        sbfHiResTimer_queueDispatch (queue);
    }

    sbfLog_debug (queue->mLog, "queue %p exited", queue);
    sbfQueue_removeRef (queue);
}